

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialDistortion::getProperties(RadialDistortion *this,Properties *prop,int id)

{
  int in_stack_000000e4;
  char *in_stack_000000e8;
  double *in_stack_000000f0;
  char *in_stack_000000f8;
  Properties *in_stack_00000100;
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000e8,in_stack_000000e4);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000e8,in_stack_000000e4);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_000000e8,in_stack_000000e4);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_00000100,in_stack_000000f8,in_stack_000000f0);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void RadialDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("k1", id).c_str(), kd[0]);
  prop.putValue(getCameraKey("k2", id).c_str(), kd[1]);
  prop.putValue(getCameraKey("k3", id).c_str(), kd[2]);
}